

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

SuspendedRequest * __thiscall
kj::HttpServer::Connection::suspend
          (SuspendedRequest *__return_storage_ptr__,Connection *this,SuspendableRequest *suspendable
          )

{
  char *pcVar1;
  StringPtr url;
  long lVar2;
  bool bVar3;
  DebugExpression<bool> _kjCondition;
  ReleasedBuffer released;
  DebugExpression<bool> local_e9;
  ReleasedBuffer local_e8;
  Array<unsigned_char> local_c0;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_a8;
  char *local_98;
  size_t sStack_90;
  HttpHeaders local_88;
  
  pcVar1 = (this->httpInput).leftover.ptr;
  lVar2 = (long)pcVar1 -
          (long)((this->httpInput).headerBuffer.ptr + (this->httpInput).messageHeaderEnd);
  if (lVar2 == 1) {
    bVar3 = pcVar1[-1] == '\n';
  }
  else if (((lVar2 != 2) || (pcVar1[-1] != '\n')) || (bVar3 = true, pcVar1[-2] != '\r')) {
    bVar3 = false;
  }
  if ((this->httpInput).broken == true) {
    local_e9.value = false;
  }
  else {
    local_e9.value = (bool)((this->httpInput).headerBuffer.size_ != 0 & bVar3);
    if (local_e9.value != false) {
      anon_unknown_36::HttpInputStreamImpl::releaseBuffer(&local_e8,&this->httpInput);
      local_c0.ptr = local_e8.buffer.ptr;
      local_c0.size_ = local_e8.buffer.size_;
      local_c0.disposer = local_e8.buffer.disposer;
      local_e8.buffer.ptr = (uchar *)0x0;
      local_e8.buffer.size_ = 0;
      local_a8.tag = (suspendable->method).tag;
      if (local_a8.tag == 1) {
        local_a8.field_1.space = (byte  [4])*(undefined4 *)&(suspendable->method).field_1;
      }
      local_98 = (suspendable->url).content.ptr;
      sStack_90 = (suspendable->url).content.size_;
      HttpHeaders::cloneShallow(&local_88,suspendable->headers);
      url.content.size_ = sStack_90;
      url.content.ptr = local_98;
      SuspendedRequest::SuspendedRequest
                (__return_storage_ptr__,&local_c0,local_e8.leftover,&local_a8,url,&local_88);
      HttpHeaders::~HttpHeaders(&local_88);
      Array<unsigned_char>::~Array(&local_c0);
      Array<unsigned_char>::~Array(&local_e8.buffer);
      this->suspended = true;
      return __return_storage_ptr__;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[65]>
            ((Fault *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1d0a,FAILED,"httpInput.canSuspend()",
             "_kjCondition,\"suspend() may only be called before the request body is consumed\"",
             &local_e9,
             (char (*) [65])"suspend() may only be called before the request body is consumed");
  kj::_::Debug::Fault::fatal((Fault *)&local_e8);
}

Assistant:

SuspendedRequest suspend(SuspendableRequest& suspendable) {
    KJ_REQUIRE(httpInput.canSuspend(),
        "suspend() may only be called before the request body is consumed");
    KJ_DEFER(suspended = true);
    auto released = httpInput.releaseBuffer();
    return {
      kj::mv(released.buffer),
      released.leftover,
      suspendable.method,
      suspendable.url,
      suspendable.headers.cloneShallow(),
    };
  }